

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash_prov.c
# Opt level: O0

void * siphash_new(void *provctx)

{
  int iVar1;
  undefined8 in_RDI;
  siphash_data_st *ctx;
  char *in_stack_fffffffffffffff8;
  undefined8 *puVar2;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = (undefined8 *)
             CRYPTO_zalloc((size_t)ctx,in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = in_RDI;
    }
  }
  return puVar2;
}

Assistant:

static void *siphash_new(void *provctx)
{
    struct siphash_data_st *ctx;

    if (!ossl_prov_is_running())
        return NULL;
    ctx = OPENSSL_zalloc(sizeof(*ctx));
    if (ctx != NULL)
        ctx->provctx = provctx;
    return ctx;
}